

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O3

bool __thiscall
cmRuntimeDependencyArchive::IsPostExcluded(cmRuntimeDependencyArchive *this,string *name)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  anon_class_32_1_898f2789_for__M_pred fileMatch;
  anon_class_40_2_f7e7401d_for__M_pred regexMatch;
  RegularExpressionMatch match;
  anon_class_8_1_c61d8849 *local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_270;
  anon_class_8_1_c61d8849 local_268 [2];
  anon_class_8_1_60cb577c local_258;
  long *local_250 [2];
  long local_240 [2];
  anon_class_40_2_f7e7401d_for__M_pred local_230 [13];
  
  memset(local_230,0,0x208);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_258.regexMatch = local_230;
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_250,pcVar1,pcVar1 + name->_M_string_length);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_278 = local_268;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,pcVar1,pcVar1 + name->_M_string_length);
  bVar2 = IsPostExcluded::anon_class_8_1_c61d8849::operator()(local_278,local_270);
  bVar3 = true;
  if (!bVar2) {
    bVar2 = IsPostExcluded::anon_class_8_1_60cb577c::operator()
                      (&local_258,
                       (vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                        *)(this->PostIncludeRegexes).
                          super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    if (!bVar2) {
      bVar2 = IsPostExcluded::anon_class_8_1_c61d8849::operator()(local_278,local_270);
      if (!bVar2) {
        bVar2 = IsPostExcluded::anon_class_8_1_60cb577c::operator()
                          (&local_258,
                           (vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                            *)(this->PostExcludeRegexes).
                              super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        if (!bVar2) {
          bVar3 = IsPostExcluded::anon_class_8_1_c61d8849::operator()(local_278,local_270);
        }
        goto LAB_0059b257;
      }
    }
    bVar3 = false;
  }
LAB_0059b257:
  if (local_278 != local_268) {
    operator_delete(local_278,(ulong)((long)&((local_268[0].fileMatch)->name)._M_dataplus._M_p + 1))
    ;
  }
  if (local_250[0] != local_240) {
    operator_delete(local_250[0],local_240[0] + 1);
  }
  return bVar3;
}

Assistant:

bool cmRuntimeDependencyArchive::IsPostExcluded(const std::string& name) const
{
  cmsys::RegularExpressionMatch match;
  auto const regexMatch =
    [&match, name](const cmsys::RegularExpression& regex) -> bool {
    return regex.find(name.c_str(), match);
  };
  auto const regexSearch =
    [&regexMatch](
      const std::vector<cmsys::RegularExpression>& regexes) -> bool {
    return std::any_of(regexes.begin(), regexes.end(), regexMatch);
  };
  auto const fileMatch = [name](const std::string& file) -> bool {
    return cmSystemTools::SameFile(file, name);
  };
  auto const fileSearch =
    [&fileMatch](const std::vector<std::string>& files) -> bool {
    return std::any_of(files.begin(), files.end(), fileMatch);
  };

  return fileSearch(this->PostExcludeFilesStrict) ||
    (!(regexSearch(this->PostIncludeRegexes) ||
       fileSearch(this->PostIncludeFiles)) &&
     (regexSearch(this->PostExcludeRegexes) ||
      fileSearch(this->PostExcludeFiles)));
}